

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O1

void __thiscall OpenMD::GB::calcForce(GB *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  char cVar5;
  pointer piVar6;
  uint i_2;
  long lVar7;
  uint i;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double tmp;
  double tmp_1;
  double tmp_2;
  double dVar18;
  double dVar19;
  double dVar20;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_2;
  double local_278 [4];
  double local_258 [4];
  double local_238 [4];
  double local_218 [4];
  double local_1f8;
  double local_1e8;
  double local_1d8 [4];
  double local_1b8;
  ulong uStack_1b0;
  double local_1a8;
  double local_198 [4];
  double local_178 [4];
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8 [4];
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48;
  ulong uStack_40;
  double local_38;
  ulong uStack_30;
  double local_28 [3];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar6 = (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar6[idat->atid1]].
                    super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar8 = (long)piVar6[idat->atid2] * 0x50;
  local_1a8 = *(double *)(lVar7 + lVar8);
  local_110 = *(double *)(lVar7 + 8 + lVar8);
  local_140 = *(double *)(lVar7 + 0x10 + lVar8);
  local_c8 = *(double *)(lVar7 + 0x18 + lVar8);
  local_108 = *(double *)(lVar7 + 0x20 + lVar8);
  local_100 = *(double *)(lVar7 + 0x28 + lVar8);
  local_1b8 = *(double *)(lVar7 + 0x30 + lVar8);
  uStack_1b0 = 0;
  local_f8 = *(double *)(lVar7 + 0x38 + lVar8);
  local_f0 = *(double *)(lVar7 + 0x40 + lVar8);
  local_178[2] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
  local_178[0] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [0];
  local_178[1] = (idat->A1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [1];
  local_198[2] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
  local_198[0] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [0];
  local_198[1] = (idat->A2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [1];
  cVar4 = *(char *)(lVar7 + 0x48 + lVar8);
  if (cVar4 == '\x01') {
    local_178[2] = (double)OpenMD::V3Zero._16_8_;
    local_178[0] = (double)OpenMD::V3Zero._0_8_;
    local_178[1] = (double)OpenMD::V3Zero._8_8_;
    local_138 = 0.0;
  }
  else {
    local_138 = 0.0;
    lVar9 = 0;
    do {
      local_138 = local_138 + (idat->d).super_Vector<double,_3U>.data_[lVar9] * local_178[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
  }
  cVar5 = *(char *)(lVar7 + lVar8 + 0x49);
  if (cVar5 == '\x01') {
    local_198[2] = (double)OpenMD::V3Zero._16_8_;
    local_198[0] = (double)OpenMD::V3Zero._0_8_;
    local_198[1] = (double)OpenMD::V3Zero._8_8_;
    local_148 = 0.0;
  }
  else {
    local_148 = 0.0;
    lVar7 = 0;
    do {
      local_148 = local_148 + (idat->d).super_Vector<double,_3U>.data_[lVar7] * local_198[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  local_150 = 0.0;
  if (cVar4 == '\0' && cVar5 == '\0') {
    lVar7 = 0;
    do {
      local_150 = local_150 + local_178[lVar7] * local_198[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  local_138 = local_138 / idat->rij;
  local_148 = local_148 / idat->rij;
  local_1f8 = 1.0 - local_c8 * local_150 * local_150;
  dVar14 = local_148 * local_148 * local_f0;
  dVar20 = local_138 * local_138 * local_f8;
  local_b8 = (local_c8 * -2.0 * local_138 * local_148 * local_150 +
             local_108 * local_138 * local_138 + local_100 * local_148 * local_148) / local_1f8;
  dVar19 = local_1b8 * -2.0 * local_138 * local_148 * local_150;
  local_1e8 = 1.0 - local_150 * local_150 * local_1b8;
  uStack_b0 = 0;
  dVar11 = 1.0 - local_b8;
  uStack_c0 = 0;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  local_48 = -local_c8;
  uStack_40 = uStack_c0 ^ 0x8000000000000000;
  local_38 = -local_1b8;
  uStack_30 = uStack_1b0 ^ 0x8000000000000000;
  dVar20 = (dVar19 + dVar20 + dVar14) / local_1e8;
  dVar11 = local_1a8 / dVar11;
  if (local_1f8 < 0.0) {
    dVar14 = sqrt(local_1f8);
  }
  else {
    dVar14 = SQRT(local_1f8);
  }
  local_158 = 1.0 - dVar20;
  local_130 = pow(1.0 / dVar14,this->nu_);
  dVar16 = pow(local_158,this->mu_);
  dVar14 = idat->rij;
  dVar19 = idat->vdwMult;
  dVar12 = (local_1a8 * local_140) / ((dVar14 - dVar11) + local_1a8 * local_140);
  dVar15 = dVar12 * dVar12 * dVar12;
  dVar15 = dVar15 * dVar15;
  dVar13 = dVar15 * dVar15 - dVar15;
  dVar1 = this->mu_;
  dVar2 = this->nu_;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  lVar7 = 0;
  do {
    local_1d8[lVar7] = (idat->d).super_Vector<double,_3U>.data_[lVar7] / dVar14;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar16 = local_110 * local_130 * dVar16;
  local_28[2] = local_1d8[2];
  local_28[0] = local_1d8[0];
  local_28[1] = local_1d8[1];
  dVar3 = (idat->d).super_Vector<double,_3U>.data_[0];
  dVar10 = (idat->d).super_Vector<double,_3U>.data_[1];
  dVar18 = (idat->d).super_Vector<double,_3U>.data_[2];
  local_1d8[0] = dVar10 * local_178[2] - local_178[1] * dVar18;
  local_1d8[1] = dVar18 * local_178[0] - local_178[2] * dVar3;
  dVar17 = dVar19 * 4.0 * dVar16 * dVar13;
  local_1d8[2] = dVar3 * local_178[1] - local_178[0] * dVar10;
  local_e8[0] = dVar10 * local_198[2] - dVar18 * local_198[1];
  local_e8[1] = dVar18 * local_198[0] - dVar3 * local_198[2];
  local_e8[2] = dVar3 * local_198[1] - local_198[0] * dVar10;
  local_68[0] = local_198[2] * local_178[1] - local_178[2] * local_198[1];
  local_68[1] = local_198[0] * local_178[2] - local_178[0] * local_198[2];
  local_68[2] = local_178[0] * local_198[1] - local_198[0] * local_178[1];
  dVar3 = idat->sw;
  dVar10 = dVar17 * dVar3;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar10;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar10 + (idat->selePot).data_[1];
  }
  dVar11 = dVar11 * dVar11 * dVar11;
  dVar12 = dVar12 * dVar15;
  dVar10 = local_1a8 * local_1a8 * local_1a8;
  dVar18 = (dVar19 * -8.0 * dVar16 * dVar1 * dVar13) / (local_158 * dVar14);
  dVar19 = ((dVar15 * dVar12 * 6.0 + dVar12 * -3.0) * dVar19 * 8.0 * dVar16 * dVar11) /
           (local_140 * dVar14 * dVar10);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar7 = 0;
  do {
    local_278[lVar7] =
         local_28[lVar7] *
         -(dVar18 * dVar20 + ((local_1a8 * local_1a8 * dVar14) / dVar11 + local_b8) * dVar19);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar14 = ((local_f8 * local_138 + local_38 * local_148 * local_150) * dVar18) / local_1e8 +
           ((local_108 * local_138 + local_48 * local_148 * local_150) * dVar19) / local_1f8;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar7 = 0;
  do {
    local_88[lVar7] = local_178[lVar7] * dVar14;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar20 = (dVar16 * 4.0 * dVar2 * dVar13 * local_c8 * local_150) / local_1f8 +
           (((local_1b8 * local_138 * local_148 - local_1b8 * dVar20 * local_150) *
            dVar16 * 8.0 * dVar1 * dVar13) / local_1e8) / local_158 +
           (((local_c8 * local_138 * local_148 - local_c8 * local_b8 * local_150) *
            (dVar12 * 3.0 + dVar15 * dVar12 * -6.0) * dVar16 * 8.0 * dVar11) / local_1f8) /
           (local_140 * dVar10);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar7 = 0;
  do {
    local_258[lVar7] = local_278[lVar7] + local_88[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar11 = ((local_f0 * local_148 - local_1b8 * local_138 * local_150) * dVar18) / local_1e8 +
           ((local_100 * local_148 - local_c8 * local_138 * local_150) * dVar19) / local_1f8;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar7 = 0;
  do {
    local_a8[lVar7] = local_198[lVar7] * dVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar7 = 0;
  do {
    local_238[lVar7] = local_258[lVar7] + local_a8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_218[2] = 0.0;
  lVar7 = 0;
  do {
    local_218[lVar7] = local_238[lVar7] * dVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar7] =
         local_218[lVar7] + (idat->f1).super_Vector<double,_3U>.data_[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar7 = 0;
  do {
    local_258[lVar7] = local_1d8[lVar7] * dVar14;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar7 = 0;
  do {
    local_278[lVar7] = local_68[lVar7] * dVar20;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar7 = 0;
  do {
    local_238[lVar7] = local_258[lVar7] - local_278[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_218[2] = 0.0;
  lVar7 = 0;
  do {
    local_218[lVar7] = local_238[lVar7] * dVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    (idat->t1).super_Vector<double,_3U>.data_[lVar7] =
         local_218[lVar7] + (idat->t1).super_Vector<double,_3U>.data_[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  lVar7 = 0;
  do {
    local_258[lVar7] = local_e8[lVar7] * dVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  lVar7 = 0;
  do {
    local_278[lVar7] = local_68[lVar7] * dVar20;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  lVar7 = 0;
  do {
    local_238[lVar7] = local_258[lVar7] + local_278[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_218[2] = 0.0;
  lVar7 = 0;
  do {
    local_218[lVar7] = local_238[lVar7] * dVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    (idat->t2).super_Vector<double,_3U>.data_[lVar7] =
         local_218[lVar7] + (idat->t2).super_Vector<double,_3U>.data_[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  idat->vpair = dVar17 + idat->vpair;
  return;
}

Assistant:

void GB::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    GBInteractionData& mixer =
        MixingMap[GBtids[idat.atid1]][GBtids[idat.atid2]];

    RealType sigma0 = mixer.sigma0;
    RealType dw     = mixer.dw;
    RealType eps0   = mixer.eps0;
    RealType x2     = mixer.x2;
    RealType xa2    = mixer.xa2;
    RealType xai2   = mixer.xai2;
    RealType xp2    = mixer.xp2;
    RealType xpap2  = mixer.xpap2;
    RealType xpapi2 = mixer.xpapi2;

    Vector3d ul1 = idat.A1.getRow(2);
    Vector3d ul2 = idat.A2.getRow(2);

    RealType a, b, g;

    if (mixer.i_is_LJ) {
      a   = 0.0;
      ul1 = V3Zero;
    } else {
      a = dot(idat.d, ul1);
    }

    if (mixer.j_is_LJ) {
      b   = 0.0;
      ul2 = V3Zero;
    } else {
      b = dot(idat.d, ul2);
    }

    if (mixer.i_is_LJ || mixer.j_is_LJ)
      g = 0.0;
    else
      g = dot(ul1, ul2);

    RealType au = a / idat.rij;
    RealType bu = b / idat.rij;

    RealType au2 = au * au;
    RealType bu2 = bu * bu;
    RealType g2  = g * g;

    RealType H =
        (xa2 * au2 + xai2 * bu2 - 2.0 * x2 * au * bu * g) / (1.0 - x2 * g2);
    RealType Hp = (xpap2 * au2 + xpapi2 * bu2 - 2.0 * xp2 * au * bu * g) /
                  (1.0 - xp2 * g2);

    RealType sigma = sigma0 / sqrt(1.0 - H);
    RealType e1    = 1.0 / sqrt(1.0 - x2 * g2);
    RealType e2    = 1.0 - Hp;
    RealType eps   = eps0 * pow(e1, nu_) * pow(e2, mu_);
    RealType BigR  = dw * sigma0 / (idat.rij - sigma + dw * sigma0);

    RealType R3  = BigR * BigR * BigR;
    RealType R6  = R3 * R3;
    RealType R7  = R6 * BigR;
    RealType R12 = R6 * R6;
    RealType R13 = R6 * R7;

    RealType U = idat.vdwMult * 4.0 * eps * (R12 - R6);

    RealType s3  = sigma * sigma * sigma;
    RealType s03 = sigma0 * sigma0 * sigma0;

    RealType pref1 =
        -idat.vdwMult * 8.0 * eps * mu_ * (R12 - R6) / (e2 * idat.rij);

    RealType pref2 = idat.vdwMult * 8.0 * eps * s3 * (6.0 * R13 - 3.0 * R7) /
                     (dw * idat.rij * s03);

    RealType dUdr =
        -(pref1 * Hp + pref2 * (sigma0 * sigma0 * idat.rij / s3 + H));

    RealType dUda = pref1 * (xpap2 * au - xp2 * bu * g) / (1.0 - xp2 * g2) +
                    pref2 * (xa2 * au - x2 * bu * g) / (1.0 - x2 * g2);

    RealType dUdb = pref1 * (xpapi2 * bu - xp2 * au * g) / (1.0 - xp2 * g2) +
                    pref2 * (xai2 * bu - x2 * au * g) / (1.0 - x2 * g2);

    RealType dUdg = 4.0 * eps * nu_ * (R12 - R6) * x2 * g / (1.0 - x2 * g2) +
                    8.0 * eps * mu_ * (R12 - R6) *
                        (xp2 * au * bu - Hp * xp2 * g) / (1.0 - xp2 * g2) / e2 +
                    8.0 * eps * s3 * (3.0 * R7 - 6.0 * R13) *
                        (x2 * au * bu - H * x2 * g) / (1.0 - x2 * g2) /
                        (dw * s03);

    Vector3d rhat = idat.d / idat.rij;
    Vector3d rxu1 = cross(idat.d, ul1);
    Vector3d rxu2 = cross(idat.d, ul2);
    Vector3d uxu  = cross(ul1, ul2);

    idat.pot[VANDERWAALS_FAMILY] += U * idat.sw;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += U * idat.sw;

    idat.f1 += (dUdr * rhat + dUda * ul1 + dUdb * ul2) * idat.sw;
    idat.t1 += (dUda * rxu1 - dUdg * uxu) * idat.sw;
    idat.t2 += (dUdb * rxu2 + dUdg * uxu) * idat.sw;
    idat.vpair += U;
    return;
  }